

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptAction(WriteIncludesBase *this,DomAction *node)

{
  DomAction *in_RSI;
  TreeWalker *in_RDI;
  long in_FS_OFFSET;
  DomCustomWidget *in_stack_00000010;
  QString *in_stack_00000018;
  WriteIncludesBase *in_stack_00000020;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<char16_t> *)0x0;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"QAction",7);
  QString::QString((QString *)this_00,in_stack_ffffffffffffff78);
  add(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  QString::~QString((QString *)0x197fff);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  TreeWalker::acceptAction(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptAction(DomAction *node)
{
    add(QStringLiteral("QAction"));
    TreeWalker::acceptAction(node);
}